

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

bool BicTest3<Blob<88>,unsigned_int>(pfHash hash,int reps,bool verbose)

{
  uint32_t uVar1;
  reference pvVar2;
  int iVar3;
  ulong uVar4;
  byte in_DL;
  int in_ESI;
  code *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool result;
  int i;
  double b2;
  int b_1;
  double bias;
  int *bins_1;
  int *page_1;
  int keybit_1;
  int out2_1;
  int out1_1;
  uint32_t x;
  int *b;
  int out2;
  int out1;
  uint d;
  int irep;
  int *page;
  int keybit;
  vector<int,_std::allocator<int>_> bins;
  uint h2;
  uint h1;
  Blob<88> key;
  int maxB;
  int maxA;
  int maxK;
  double maxBias;
  Rand r;
  int pagesize;
  int hashbits;
  int hashbytes;
  int keybits;
  int keybytes;
  uint32_t in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  byte bVar7;
  uint32_t in_stack_ffffffffffffff04;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  void *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  double local_d8;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint32_t local_a8;
  uint32_t local_a4;
  uint local_a0;
  int local_9c;
  reference local_98;
  int local_90;
  allocator_type local_7d;
  undefined4 local_7c;
  vector<int,_std::allocator<int>_> local_78;
  uint local_60;
  uint local_5c;
  Blob<88> local_57;
  uint local_4c;
  uint local_48;
  uint local_44;
  double local_40;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  byte local_d;
  int local_c;
  code *local_8;
  
  local_d = in_DL & 1;
  local_14 = 0xb;
  local_18 = 0x58;
  local_1c = 4;
  local_20 = 0x20;
  local_24 = 0x1000;
  local_c = in_ESI;
  local_8 = in_RDI;
  Rand::Rand((Rand *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc);
  local_40 = 0.0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  Blob<88>::Blob(&local_57);
  local_7c = 0;
  __a = &local_7d;
  std::allocator<int>::allocator((allocator<int> *)0x132241);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (size_type)in_stack_ffffffffffffff18,
             (value_type_conflict *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             __a);
  std::allocator<int>::~allocator((allocator<int> *)0x13226f);
  for (local_90 = 0; local_90 < 0x58; local_90 = local_90 + 1) {
    if (local_90 % 8 == 0) {
      printf(".");
    }
    local_98 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)(local_90 << 0xc))
    ;
    for (local_9c = 0; local_9c < local_c; local_9c = local_9c + 1) {
      Rand::rand_p((Rand *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      (*local_8)(&local_57,0xb,0,&local_5c);
      flipbit<Blob<88>>((Blob<88> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
      (*local_8)(&local_57,0xb,0,&local_60);
      local_a0 = local_5c ^ local_60;
      for (local_a4 = 0; local_a8 = local_a4, (int)local_a4 < 0x1f; local_a4 = local_a4 + 1) {
        while (pvVar2 = local_98, local_a8 = local_a8 + 1, (int)local_a8 < 0x20) {
          iVar3 = local_a4 * 0x20 + local_a8;
          in_stack_ffffffffffffff04 = getbit<unsigned_int>(&local_a0,local_a4);
          uVar1 = getbit<unsigned_int>(&local_a0,local_a8);
          uVar4 = (ulong)(in_stack_ffffffffffffff04 | uVar1 << 1);
          pvVar2[(long)(iVar3 * 4) + uVar4] = pvVar2[(long)(iVar3 * 4) + uVar4] + 1;
        }
      }
    }
  }
  printf("\n");
  for (local_b8 = 0; local_bc = local_b8, (int)local_b8 < 0x1f; local_b8 = local_b8 + 1) {
    while (local_bc = local_bc + 1, (int)local_bc < 0x20) {
      if ((local_d & 1) != 0) {
        printf("(%3d,%3d) - ",(ulong)local_b8,(ulong)local_bc);
      }
      for (local_c0 = 0; (int)local_c0 < 0x58; local_c0 = local_c0 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_78,(long)(int)(local_c0 << 0xc));
        local_d8 = 0.0;
        for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (double)pvVar2[(long)(int)((local_b8 * 0x20 + local_bc) * 4) + (long)iVar3]
                         / (double)(local_c / 2);
          auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar5,ZEXT816(0xbff0000000000000));
          auVar6._8_8_ = 0x7fffffffffffffff;
          auVar6._0_8_ = 0x7fffffffffffffff;
          auVar5 = vpand_avx(auVar5,auVar6);
          if (local_d8 < auVar5._0_8_) {
            local_d8 = auVar5._0_8_;
          }
        }
        if (local_40 < local_d8) {
          local_40 = local_d8;
          local_44 = local_c0;
          local_48 = local_b8;
          local_4c = local_bc;
        }
        if ((local_d & 1) != 0) {
          if (0.01 <= local_d8) {
            if (0.05 <= local_d8) {
              if (0.33 <= local_d8) {
                printf("X");
              }
              else {
                printf("O");
              }
            }
            else {
              printf("o");
            }
          }
          else {
            printf(".");
          }
        }
      }
      if ((local_d & 1) != 0) {
        printf("\n");
      }
    }
    if ((local_d & 1) != 0) {
      for (in_stack_ffffffffffffff14 = 0; in_stack_ffffffffffffff14 < 100;
          in_stack_ffffffffffffff14 = in_stack_ffffffffffffff14 + 1) {
        printf("-");
      }
      printf("\n");
    }
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",local_40,(ulong)local_44,(ulong)local_48,(ulong)local_4c)
  ;
  bVar7 = local_40 < 0.05;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,CONCAT13(bVar7,(int3)in_stack_ffffffffffffff10)));
  return (bool)(bVar7 & 1);
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}